

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O1

QString * __thiscall
QGraphicsSceneBspTree::debug(QString *__return_storage_ptr__,QGraphicsSceneBspTree *this,int index)

{
  Type TVar1;
  int *piVar2;
  Node *pNVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QArrayData *local_e8 [3];
  QArrayData *local_d0 [3];
  QArrayData *local_b8 [3];
  QArrayData *local_a0 [3];
  QArrayData *local_88 [3];
  QArrayData *local_70 [3];
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar3 = (this->nodes).d.ptr;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  TVar1 = pNVar3[index].type;
  if ((TVar1 == Horizontal) || (TVar1 != Leaf)) {
    debug((QString *)&local_58,this,index * 2 + 1);
    QString::append((QString *)__return_storage_ptr__);
    piVar2 = (int *)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_),2,0x10);
      }
    }
    debug((QString *)&local_58,this,index * 2 + 2);
    QString::append((QString *)__return_storage_ptr__);
    piVar2 = (int *)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
    if (piVar2 == (int *)0x0) goto LAB_0062fb6c;
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) goto LAB_0062fb6c;
    local_e8[0] = (QArrayData *)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
  }
  else {
    pNVar3 = pNVar3 + index;
    local_58.w._0_4_ = 0xffffffff;
    local_58.w._4_4_ = 0xffffffff;
    local_58.h._0_4_ = 0xffffffff;
    local_58.h._4_4_ = 0xffffffff;
    local_58.xp._0_4_ = 0xffffffff;
    local_58.xp._4_4_ = 0xffffffff;
    local_58.yp._0_4_ = 0xffffffff;
    local_58.yp._4_4_ = 0xffffffff;
    rectForIndex(&local_58,this,index);
    if ((this->leaves).d.ptr[(pNVar3->field_0).leafIndex].d.size == 0) goto LAB_0062fb6c;
    QVar4.m_data = (storage_type *)0x23;
    QVar4.m_size = (qsizetype)local_e8;
    QString::fromLatin1(QVar4);
    QString::arg_impl((double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_),(int)local_d0,
                      (char)local_e8,0,(QChar)0x67);
    QString::arg_impl((double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_),(int)local_b8,
                      (char)local_d0,0,(QChar)0x67);
    QString::arg_impl((double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_),(int)local_a0,
                      (char)local_b8,0,(QChar)0x67);
    QString::arg_impl((double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_),(int)local_88,
                      (char)local_a0,0,(QChar)0x67);
    QString::arg_impl((longlong)local_70,(int)local_88,
                      (int)(this->leaves).d.ptr[(pNVar3->field_0).leafIndex].d.size,(QChar)0x0);
    QString::append((QString *)__return_storage_ptr__);
    if (local_70[0] != (QArrayData *)0x0) {
      LOCK();
      (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70[0],2,0x10);
      }
    }
    if (local_88[0] != (QArrayData *)0x0) {
      LOCK();
      (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88[0],2,0x10);
      }
    }
    if (local_a0[0] != (QArrayData *)0x0) {
      LOCK();
      (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a0[0],2,0x10);
      }
    }
    if (local_b8[0] != (QArrayData *)0x0) {
      LOCK();
      (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8[0],2,0x10);
      }
    }
    if (local_d0[0] != (QArrayData *)0x0) {
      LOCK();
      (local_d0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d0[0],2,0x10);
      }
    }
    if (local_e8[0] == (QArrayData *)0x0) goto LAB_0062fb6c;
    LOCK();
    (local_e8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_e8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_e8[0]->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_0062fb6c;
  }
  QArrayData::deallocate(local_e8[0],2,0x10);
LAB_0062fb6c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QGraphicsSceneBspTree::debug(int index) const
{
    const Node *node = &nodes.at(index);

    QString tmp;
    if (node->type == Node::Leaf) {
        QRectF rect = rectForIndex(index);
        if (!leaves[node->leafIndex].isEmpty()) {
            tmp += QString::fromLatin1("[%1, %2, %3, %4] contains %5 items\n")
                   .arg(rect.left()).arg(rect.top())
                   .arg(rect.width()).arg(rect.height())
                   .arg(leaves[node->leafIndex].size());
        }
    } else {
        if (node->type == Node::Horizontal) {
            tmp += debug(firstChildIndex(index));
            tmp += debug(firstChildIndex(index) + 1);
        } else {
            tmp += debug(firstChildIndex(index));
            tmp += debug(firstChildIndex(index) + 1);
        }
    }

    return tmp;
}